

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O2

void get_spc_info(header_t *h,byte_ *xid6,long xid6_size,track_info_t *out)

{
  byte_ *in;
  byte_ bVar1;
  uint in_size;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int in_size_00;
  byte *in_00;
  char *out_00;
  byte_ *pbVar7;
  byte_ *pbVar8;
  byte_ *pbVar9;
  byte_ *pbVar10;
  size_t local_168;
  byte local_138 [4];
  undefined1 local_134;
  byte local_133 [259];
  
  uVar3 = 0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    uVar6 = h->len_secs[lVar4] - 0x30;
    if (9 < uVar6) {
      if (lVar4 == 1) {
        if (h->author[1] == '\0') {
          uVar3 = 0;
        }
        if (h->author[0] != '\0') {
          uVar3 = 0;
        }
      }
      break;
    }
    uVar3 = (ulong)uVar6 + uVar3 * 10;
  }
  uVar5 = uVar3;
  if (0x1fff < (long)uVar3) {
    uVar5 = (ulong)*(ushort *)h->len_secs;
  }
  if (uVar3 == 0) {
    uVar5 = (ulong)*(ushort *)h->len_secs;
  }
  if ((long)uVar5 < 0x1fff) {
    out->length = uVar5 * 1000;
  }
  bVar2 = (byte)h->author[0] - 0x30 < 10 || h->author[0] < ' ';
  Gme_File::copy_field_(out->author,h->author + bVar2,0x20 - (uint)bVar2);
  Gme_File::copy_field_(out->song,h->song,0x20);
  Gme_File::copy_field_(out->game,h->game,0x20);
  Gme_File::copy_field_(out->dumper,h->dumper,0x10);
  Gme_File::copy_field_(out->comment,h->comment,0x20);
  if (((xid6_size != 0) && (7 < xid6_size)) && (*(int *)xid6 == 0x36646978)) {
    pbVar10 = xid6 + (ulong)*(uint *)(xid6 + 4) + 8;
    if (xid6_size - 8U <= (ulong)*(uint *)(xid6 + 4)) {
      pbVar10 = xid6 + xid6_size;
    }
    local_168 = 0;
    uVar6 = 0;
    pbVar7 = xid6 + 8;
LAB_0061c1b3:
    if (3 < (long)pbVar10 - (long)pbVar7) {
      in_size = (uint)*(ushort *)(pbVar7 + 2);
      if (pbVar7[1] == '\0') {
        in_size = 0;
      }
      uVar3 = (ulong)in_size;
      in = pbVar7 + 4;
      if ((long)pbVar10 - (long)in < (long)uVar3) goto LAB_0061c2a4;
      bVar1 = *pbVar7;
      out_00 = out->song;
      switch(bVar1) {
      case '\x01':
        break;
      case '\x02':
        out_00 = out->game;
        break;
      case '\x03':
        out_00 = out->author;
        break;
      case '\x04':
        out_00 = out->dumper;
        break;
      case '\x05':
      case '\x06':
        goto switchD_0061c20d_caseD_5;
      case '\a':
        out_00 = out->comment;
        break;
      default:
        if (bVar1 == '\x13') {
          local_168 = 0x100;
          if (in_size < 0x100) {
            local_168 = (size_t)in_size;
          }
          memcpy(local_133,in,local_168);
        }
        else if (bVar1 == '\x14') {
          uVar6 = (uint)*(ushort *)(pbVar7 + 2);
        }
        goto switchD_0061c20d_caseD_5;
      }
      Gme_File::copy_field_(out_00,(char *)in,in_size);
switchD_0061c20d_caseD_5:
      pbVar8 = pbVar7 + uVar3 + (4 - (long)xid6);
      pbVar9 = in + uVar3;
      do {
        pbVar7 = pbVar9;
        if ((pbVar10 <= pbVar9) || (((ulong)pbVar8 & 3) == 0)) break;
        pbVar8 = pbVar8 + 1;
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        pbVar7 = in + uVar3;
      } while (bVar1 == '\0');
      goto LAB_0061c1b3;
    }
LAB_0061c2a4:
    in_size_00 = (int)local_168;
    if (uVar6 == 0) {
      in_00 = local_133;
      if (in_size_00 == 0) {
        return;
      }
    }
    else {
      local_134 = 0x20;
      for (lVar4 = 3; (int)lVar4 != -1; lVar4 = lVar4 + -1) {
        uVar3 = (ulong)uVar6;
        uVar6 = uVar6 / 10;
        local_138[lVar4] = (byte)(uVar3 % 10) | 0x30;
      }
      in_size_00 = in_size_00 + 5;
      in_00 = local_138;
    }
    Gme_File::copy_field_(out->copyright,(char *)in_00,in_size_00);
  }
  return;
}

Assistant:

static void get_spc_info( Spc_Emu::header_t const& h, byte const* xid6, long xid6_size,
		track_info_t* out )
{
	// decode length (can be in text or binary format, sometimes ambiguous ugh)
	long len_secs = 0;
	for ( int i = 0; i < 3; i++ )
	{
		unsigned n = h.len_secs [i] - '0';
		if ( n > 9 )
		{
			// ignore single-digit text lengths
			// (except if author field is present and begins at offset 1, ugh)
			if ( i == 1 && (h.author [0] || !h.author [1]) )
				len_secs = 0;
			break;
		}
		len_secs *= 10;
		len_secs += n;
	}
	if ( !len_secs || len_secs > 0x1FFF )
		len_secs = get_le16( h.len_secs );
	if ( len_secs < 0x1FFF )
		out->length = len_secs * 1000;
	
	int offset = (h.author [0] < ' ' || unsigned (h.author [0] - '0') <= 9);
	Gme_File::copy_field_( out->author, &h.author [offset], sizeof h.author - offset );
	
	GME_COPY_FIELD( h, out, song );
	GME_COPY_FIELD( h, out, game );
	GME_COPY_FIELD( h, out, dumper );
	GME_COPY_FIELD( h, out, comment );
	
	if ( xid6_size )
		get_spc_xid6( xid6, xid6_size, out );
}